

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOClass.cpp
# Opt level: O2

string * __thiscall
GPIOClass::get_gpionum_abi_cxx11_(string *__return_storage_ptr__,GPIOClass *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

string GPIOClass::get_gpionum(){

return this->gpionum;

}